

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.c
# Opt level: O2

PyObject * libxml_xmlTextReaderPtrWrap(xmlTextReaderPtr reader)

{
  PyObject *pPVar1;
  
  if (reader != (xmlTextReaderPtr)0x0) {
    pPVar1 = (PyObject *)PyCapsule_New(reader,"xmlTextReaderPtr",0);
    return pPVar1;
  }
  __Py_NoneStruct = __Py_NoneStruct + 1;
  return (PyObject *)&_Py_NoneStruct;
}

Assistant:

PyObject *
libxml_xmlTextReaderPtrWrap(xmlTextReaderPtr reader)
{
    PyObject *ret;

    if (reader == NULL) {
        Py_INCREF(Py_None);
        return (Py_None);
    }
    ret =
        PyCapsule_New((void *) reader,
                                     (char *) "xmlTextReaderPtr", NULL);
    return (ret);
}